

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O3

void __thiscall sznet::net::TcpClient::newConnection(TcpClient *this,sz_sock sockfd)

{
  MutexLock *mutex;
  uint id;
  EventLoop *this_00;
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  TcpConnection *this_01;
  undefined1 auStack_e8 [8];
  InetAddress peerAddr;
  char buf [32];
  InetAddress localAddr;
  undefined1 local_80 [24];
  uint32_t uStack_68;
  undefined4 uStack_64;
  undefined1 local_60 [8];
  string connName;
  TcpConnectionPtr conn;
  
  this_00 = this->m_loop;
  bVar3 = EventLoop::isInLoopThread(this_00);
  if (!bVar3) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  sockets::sz_sock_getpeeraddr((sockaddr_in6 *)((long)&peerAddr.field_0 + 0x18),sockfd);
  peerAddr.field_0._12_1_ = buf[0xc];
  peerAddr.field_0._13_1_ = buf[0xd];
  peerAddr.field_0._14_1_ = buf[0xe];
  peerAddr.field_0._15_1_ = buf[0xf];
  peerAddr.field_0._16_1_ = buf[0x10];
  peerAddr.field_0._17_1_ = buf[0x11];
  peerAddr.field_0._18_1_ = buf[0x12];
  peerAddr.field_0._19_1_ = buf[0x13];
  auStack_e8 = (undefined1  [8])stack0xffffffffffffff38;
  id = this->m_nextConnId;
  this->m_nextConnId = id + 1;
  InetAddress::toIpPort_abi_cxx11_((string *)local_60,(InetAddress *)auStack_e8);
  snprintf((char *)&peerAddr.field_0.m_addr6.sin6_scope_id,0x20,":%s#%d",local_60,(ulong)id);
  if (local_60 != (undefined1  [8])&connName._M_string_length) {
    operator_delete((void *)local_60);
  }
  local_60 = (undefined1  [8])&connName._M_string_length;
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)local_60);
  sockets::sz_sock_getlocaladdr((sockaddr_in6 *)local_80,sockfd);
  buf[0x18] = local_80[0];
  buf[0x19] = local_80[1];
  buf[0x1a] = local_80[2];
  buf[0x1b] = local_80[3];
  buf[0x1c] = local_80[4];
  buf[0x1d] = local_80[5];
  buf[0x1e] = local_80[6];
  buf[0x1f] = local_80[7];
  this_01 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_01,this->m_loop,(string *)local_60,id,sockfd,(InetAddress *)(buf + 0x18),
             (InetAddress *)auStack_e8);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
             (connName.field_2._M_local_buf + 8),this_01);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
             (connName.field_2._8_8_ + 0x90),&this->m_connectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
               *)(connName.field_2._8_8_ + 0xb0),&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
             (connName.field_2._8_8_ + 0xd0),&this->m_writeCompleteCallback);
  uVar2 = connName.field_2._8_8_;
  local_80._8_4_ = 0;
  local_80._12_4_ = 0;
  local_80._0_8_ = operator_new(0x18);
  *(code **)local_80._0_8_ = removeConnection;
  *(undefined8 *)(local_80._0_8_ + 8) = 0;
  uStack_68 = 0x12013a;
  uStack_64 = 0;
  *(TcpClient **)(local_80._0_8_ + 0x10) = this;
  local_80._16_4_ = 0x12015c;
  local_80._20_4_ = 0;
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)(uVar2 + 0x110),
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_80);
  if ((code *)CONCAT44(local_80._20_4_,local_80._16_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_80._20_4_,local_80._16_4_))(local_80,local_80,3);
  }
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)connName.field_2._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_connection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  TcpConnection::connectEstablished((TcpConnection *)connName.field_2._8_8_);
  if (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  if (local_60 != (undefined1  [8])&connName._M_string_length) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void TcpClient::newConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpClient::removeConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_connection = conn;
	}
	conn->connectEstablished();
}